

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ReservoirQuantileBindData::Copy(ReservoirQuantileBindData *this)

{
  _func_int *p_Var1;
  _func_int **pp_Var2;
  long in_RSI;
  vector<double,_std::allocator<double>_> local_38;
  
  pp_Var2 = (_func_int **)operator_new(0x28);
  ::std::vector<double,_std::allocator<double>_>::vector
            (&local_38,(vector<double,_std::allocator<double>_> *)(in_RSI + 8));
  p_Var1 = *(_func_int **)(in_RSI + 0x20);
  *pp_Var2 = (_func_int *)&PTR__ReservoirQuantileBindData_019d3ac0;
  pp_Var2[1] = (_func_int *)
               local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
  pp_Var2[2] = (_func_int *)
               local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
  pp_Var2[3] = (_func_int *)
               local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  pp_Var2[4] = p_Var1;
  (this->super_FunctionData)._vptr_FunctionData = pp_Var2;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> Copy() const override {
		return make_uniq<ReservoirQuantileBindData>(quantiles, sample_size);
	}